

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signals.c
# Opt level: O0

void server_once(int operation)

{
  int in_EDI;
  sigaction signal_action;
  sigaction *in_stack_ffffffffffffff60;
  
  setup_server_signals((sigaction *)0x1025f8);
  if (in_EDI == 0) {
    wait_for_signal(in_stack_ffffffffffffff60);
  }
  else {
    notify_client();
  }
  return;
}

Assistant:

void server_once(int operation) {
	struct sigaction signal_action;
	setup_server_signals(&signal_action);
	if (operation == WAIT) {
		wait_for_signal(&signal_action);
	} else {
		notify_client();
	}
}